

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_set_int64_Test::TestBody(Btree_set_int64_Test *this)

{
  pointer pcVar1;
  long lVar2;
  void *pvVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Base_ptr p_Var7;
  pointer p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  vector<long,_std::allocator<long>_> *extraout_RDX;
  vector<long,_std::allocator<long>_> *extraout_RDX_00;
  vector<long,_std::allocator<long>_> *values;
  undefined8 extraout_RDX_01;
  size_type *values_00;
  vector<long,_std::allocator<long>_> *values_01;
  const_pointer extraout_RDX_02;
  const_pointer extraout_RDX_03;
  const_pointer hint;
  const_pointer hint_00;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_08;
  size_type n_00;
  int i;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  pointer *__ptr;
  btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
  *__tmp;
  unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  *b;
  char *pcVar10;
  bool bVar11;
  AssertionResult AVar12;
  vector<long,_std::allocator<long>_> sorted_values;
  int64_t bytes1;
  vector<long,_std::allocator<long>_> random_values;
  int64_t original_bytes1;
  unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  container;
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator1;
  int64_t bytes2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  pointer local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8 [32];
  _Base_ptr local_a8;
  _Rb_tree_node_base local_a0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_80;
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  local_50;
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  local_48;
  long local_40;
  _Base_ptr local_38;
  
  (anonymous_namespace)::ConstTest<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>>();
  GenerateValuesWithSeed<long>
            ((vector<long,_std::allocator<long>_> *)local_c8,10000,40000,
             testing::FLAGS_gtest_random_seed);
  local_a0._M_right = &local_a0;
  local_a0._0_8_ =
       &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
        EmptyNode()::empty_node;
  local_a0._M_parent =
       (_Base_ptr)
       &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
        EmptyNode()::empty_node;
  local_a0._M_left = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_e8,
             (vector<long,_std::allocator<long>_> *)local_c8);
  pbVar8 = local_e0;
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_e8._1_7_,local_e8[0]);
  values = extraout_RDX;
  if (pbVar6 != local_e0) {
    uVar5 = (long)local_e0 - (long)pbVar6 >> 3;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar6,local_e0,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar6,pbVar8);
    values = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a0,
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_e8,values);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_e8._1_7_,local_e8[0]);
  values_00 = (size_type *)CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),pbVar6 != local_e0);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_e0[-1].field_2 + 8);
  if (pbVar6 < pbVar8 && pbVar6 != local_e0) {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &pbVar6->_M_string_length;
    do {
      pcVar1 = *(pointer *)((long)&pbVar6[-1].field_2 + 8);
      *(pointer *)((long)&pbVar6[-1].field_2 + 8) = (pbVar8->_M_dataplus)._M_p;
      (pbVar8->_M_dataplus)._M_p = pcVar1;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&pbVar8[-1].field_2 + 8);
      values_00 = &pbVar6->_M_string_length;
      bVar11 = pbVar6 < pbVar8;
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values_00;
    } while (bVar11);
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a0,
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_e8,(vector<long,_std::allocator<long>_> *)values_00);
  b = (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
       *)local_c8;
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a0,b,values_01);
  pvVar3 = (void *)CONCAT71(local_e8._1_7_,local_e8[0]);
  if (pvVar3 != (void *)0x0) {
    b = (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
         *)((long)local_d8 - (long)pvVar3);
    operator_delete(pvVar3,(ulong)b);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_80);
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::~btree
            ((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)&local_a0);
  hint = extraout_RDX_02;
  if ((btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
       *)local_c8._0_8_ !=
      (btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
       *)0x0) {
    b = (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
         *)(local_c8._16_8_ - local_c8._0_8_);
    operator_delete((void *)local_c8._0_8_,(ulong)b);
    hint = extraout_RDX_03;
  }
  local_d0 = (_Base_ptr)0x0;
  local_40 = 0;
  local_50.bytes_used_ = &local_40;
  local_48.bytes_used_ = (int64_t *)&local_d0;
  p_Var7 = (_Base_ptr)
           CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
           ::allocate(&local_48,(size_type)b,hint);
  p = CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
      ::allocate(&local_50,(size_type)b,hint_00);
  local_a0._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_right = (_Base_ptr)0x0;
  local_c8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._24_8_ = (_Base_ptr)0x0;
  local_a8 = local_d0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8._8_8_ = &local_40;
  local_a0._M_parent = (_Base_ptr)&local_d0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)local_e8,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)&local_a0,(value_type *)&local_f8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_d0,(long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if (local_a0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a0,(node_type *)local_a0._0_8_);
  }
  local_a0._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_right = (_Base_ptr)0x0;
  local_a0._M_parent = (_Base_ptr)local_c8._8_8_;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b1.size()","0",(unsigned_long *)&local_f8,(int *)&local_f0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._24_8_;
  local_f0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b2.size()","0",(unsigned_long *)&local_f8,(int *)&local_f0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_d0,(long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  local_38 = p_Var7;
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  do {
    local_f8._M_head_impl = pbVar9;
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)local_e8,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)&local_a0,(value_type *)&local_f8);
    pbVar9 = pbVar9 + 1;
  } while (pbVar9 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0x3e8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes2","bytes1",&local_40,(long *)&local_d0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if ((_Base_ptr)local_c8._24_8_ != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)local_c8,(node_type *)local_c8._0_8_);
  }
  if (local_a0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a0,(node_type *)local_a0._0_8_);
  }
  local_a0._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_parent = (_Base_ptr)local_48.bytes_used_;
  local_a0._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_right = (_Base_ptr)0x0;
  local_c8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._8_8_ = local_50.bytes_used_;
  local_c8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._24_8_ = (_Base_ptr)0x0;
  local_a8 = local_d0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)local_e8,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)&local_a0,(value_type *)&local_f8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_d0,(long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if (local_a0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a0,(node_type *)local_a0._0_8_);
  }
  p_Var7 = local_a0._M_parent;
  local_a0._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_right = (_Base_ptr)0x0;
  local_a0._M_parent = (_Base_ptr)local_c8._8_8_;
  local_c8._8_8_ = p_Var7;
  local_c8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._24_8_ = (_Base_ptr)0x0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b1.size()","0",(unsigned_long *)&local_f8,(int *)&local_f0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_d0,(long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  do {
    local_f8._M_head_impl = pbVar9;
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)local_e8,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)&local_a0,(value_type *)&local_f8);
    pbVar9 = pbVar9 + 1;
  } while (pbVar9 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0x3e8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes2","bytes1",&local_40,(long *)&local_d0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if ((_Base_ptr)local_c8._24_8_ != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)local_c8,(node_type *)local_c8._0_8_);
  }
  if (local_a0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a0,(node_type *)local_a0._0_8_);
  }
  local_a0._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_parent = (_Base_ptr)local_48.bytes_used_;
  local_a0._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_right = (_Base_ptr)0x0;
  local_c8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._8_8_ = local_50.bytes_used_;
  local_c8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._24_8_ = (_Base_ptr)0x0;
  local_a8 = local_d0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)local_e8,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)&local_a0,(value_type *)&local_f8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_d0,(long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  p_Var4 = local_a0._M_right;
  local_c8._16_8_ = local_a0._M_left;
  p_Var7 = local_a0._M_parent;
  local_c8._0_8_ = local_a0._0_8_;
  local_a0._M_parent = (_Base_ptr)local_c8._8_8_;
  local_a0._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_c8._8_8_ = p_Var7;
  local_a0._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a0._M_right = (_Base_ptr)0x0;
  local_c8._24_8_ = p_Var4;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b1.size()","0",(unsigned_long *)&local_f8,(int *)&local_f0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var4;
  local_f0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b2.size()","1",(unsigned_long *)&local_f8,(int *)&local_f0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_d0,(long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  do {
    local_f8._M_head_impl = pbVar9;
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)local_e8,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)&local_a0,(value_type *)&local_f8);
    pbVar9 = pbVar9 + 1;
  } while (pbVar9 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0x3e8);
  AVar12 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_e8,"bytes2","bytes1",&local_40,(long *)&local_d0);
  p_Var7 = local_38;
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar12.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    n = extraout_RDX_04.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
      n._M_head_impl = extraout_RDX_05;
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_06.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((_Base_ptr)local_c8._24_8_ != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)local_c8,(node_type *)local_c8._0_8_);
    n._M_head_impl = extraout_RDX_07;
  }
  if (local_a0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a0,(node_type *)local_a0._0_8_);
    n._M_head_impl = extraout_RDX_08._M_head_impl;
  }
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate(&local_48,(pointer)p_Var7,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate(&local_50,p,n_00);
  return;
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }